

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

void __thiscall gmlc::networking::AsioContextManager::haltContextLoop(AsioContextManager *this)

{
  bool bVar1;
  __int_type _Var2;
  undefined4 *puVar3;
  long in_RDI;
  int lcnt;
  lock_guard<std::mutex> nullLock;
  memory_order __b;
  mutex_type *in_stack_ffffffffffffff88;
  undefined1 __i;
  undefined4 in_stack_ffffffffffffff90;
  future_status in_stack_ffffffffffffff94;
  __atomic_base<int> *in_stack_ffffffffffffff98;
  int local_54;
  duration<long,std::ratio<1l,1000l>> local_50 [12];
  int local_44;
  duration<long,std::ratio<1l,1000l>> local_40 [8];
  int local_38;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = isRunning((AsioContextManager *)0x75f508);
  if (bVar1) {
    _Var2 = std::__atomic_base<int>::operator--((__atomic_base<int> *)(in_RDI + 0x18));
    if (_Var2 < 1) {
      CLI::std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff98);
      if ((_Var2 < 1) &&
         (bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                              *)0x75f560), bVar1)) {
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
        std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::reset
                  ((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                    *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (pointer)in_stack_ffffffffffffff88);
        std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator->
                  ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x75f59c)
        ;
        asio::io_context::stop((io_context *)0x75f5a4);
        local_38 = 0;
        while( true ) {
          local_44 = 0;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_40,&local_44);
          in_stack_ffffffffffffff94 =
               std::__basic_future<void>::wait_for<long,std::ratio<1l,1000l>>
                         ((__basic_future<void> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff88);
          if (in_stack_ffffffffffffff94 != timeout) break;
          if (local_38 == 0) {
            std::this_thread::yield();
          }
          else {
            local_54 = 0x32;
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_50,&local_54)
            ;
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffffd0);
            local_38 = local_38 + 1;
            std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator->
                      ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)
                       0x75f65d);
            asio::io_context::stop((io_context *)0x75f665);
          }
        }
        std::shared_future<void>::get((shared_future<void> *)0x75f67f);
        __i = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
        std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator->
                  ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x75f68f)
        ;
        asio::io_context::reset((io_context *)0x75f697);
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (bool)__i);
      }
      CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x75f6b8);
    }
  }
  else {
    puVar3 = (undefined4 *)(in_RDI + 0x18);
    CLI::std::operator&(seq_cst,__memory_order_mask);
    LOCK();
    *puVar3 = 0;
    UNLOCK();
  }
  return;
}

Assistant:

void AsioContextManager::haltContextLoop()
{
    if (isRunning()) {
        // std::cout << "context loop halted "<<ptr->runCounter<<"\n";
        if (--runCounter <= 0) {
            std::lock_guard<std::mutex> nullLock(runningLoopLock);
            //    std::cout << "calling halt on context loop \n";

            if (runCounter <= 0) {
                if (nullwork) {
                    terminateLoop = true;
                    nullwork.reset();
                    ictx->stop();
                    int lcnt = 0;
                    while (loopRet.wait_for(std::chrono::milliseconds(0)) ==
                           std::future_status::timeout) {
                        if (lcnt == 0) {
                            std::this_thread::yield();
                        } else {
                            std::this_thread::sleep_for(
                                std::chrono::milliseconds(50));
                            ++lcnt;
                            ictx->stop();
                        }
                    }
                    loopRet.get();
                    ictx->reset();  // prepare for future runs
                    terminateLoop = false;
                }
            }
        }
    } else {
        runCounter.store(0);
    }
}